

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::TypedAttribute
          (TypedAttribute<Imath_3_2::Matrix44<double>_> *this,Matrix44<double> *value)

{
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e3960;
  (this->_value).x[0][0] = value->x[0][0];
  (this->_value).x[0][1] = value->x[0][1];
  (this->_value).x[0][2] = value->x[0][2];
  (this->_value).x[0][3] = value->x[0][3];
  (this->_value).x[1][0] = value->x[1][0];
  (this->_value).x[1][1] = value->x[1][1];
  (this->_value).x[1][2] = value->x[1][2];
  (this->_value).x[1][3] = value->x[1][3];
  (this->_value).x[2][0] = value->x[2][0];
  (this->_value).x[2][1] = value->x[2][1];
  (this->_value).x[2][2] = value->x[2][2];
  (this->_value).x[2][3] = value->x[2][3];
  (this->_value).x[3][0] = value->x[3][0];
  (this->_value).x[3][1] = value->x[3][1];
  (this->_value).x[3][2] = value->x[3][2];
  (this->_value).x[3][3] = value->x[3][3];
  return;
}

Assistant:

TypedAttribute<T>::TypedAttribute (const T& value)
    : Attribute (), _value (value)
{
    // empty
}